

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

void __thiscall miniros::TransportTCP::enableWrite(TransportTCP *this)

{
  mutex_type *pmVar1;
  scoped_lock<std::recursive_mutex> *in_RDI;
  scoped_lock<std::recursive_mutex> lock;
  int in_stack_00000070;
  int in_stack_00000074;
  PollSet *in_stack_00000078;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::scoped_lock<std::recursive_mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = in_RDI[0x13]._M_device;
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x50e90e);
  if ((((ulong)pmVar1 & 0x100000000) == 0) && (((ulong)in_RDI[0x19]._M_device & 0x100) == 0)) {
    PollSet::addEvents(in_stack_00000078,in_stack_00000074,in_stack_00000070);
    *(undefined1 *)((long)&in_RDI[0x19]._M_device + 1) = 1;
  }
  return;
}

Assistant:

void TransportTCP::enableWrite()
{
  MINIROS_ASSERT(!(flags_ & SYNCHRONOUS));

  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);

    if (closed_)
    {
      return;
    }
  }

  if (!expecting_write_)
  {
    poll_set_->addEvents(sock_, POLLOUT);
    expecting_write_ = true;
  }
}